

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simSwitch.c
# Opt level: O1

Vec_Int_t * Sim_NtkComputeSwitching(Abc_Ntk_t *pNtk,int nPatterns)

{
  void *pvVar1;
  uint *puVar2;
  Abc_Obj_t *pNode;
  int iVar3;
  Vec_Ptr_t *vSimInfo;
  Vec_Int_t *pVVar4;
  int *__s;
  Vec_Ptr_t *pVVar5;
  int iVar6;
  int nWords;
  int nTotal;
  long lVar7;
  float fVar8;
  int nTotal_1;
  
  nWords = ((nPatterns >> 5) + 1) - (uint)((nPatterns & 0x1fU) == 0);
  __s = (int *)0x0;
  vSimInfo = Sim_UtilInfoAlloc(pNtk->vObjs->nSize,nWords,0);
  iVar3 = pNtk->vObjs->nSize;
  pVVar4 = (Vec_Int_t *)malloc(0x10);
  iVar6 = 0x10;
  if (0xe < iVar3 - 1U) {
    iVar6 = iVar3;
  }
  pVVar4->nSize = 0;
  pVVar4->nCap = iVar6;
  if (iVar6 != 0) {
    __s = (int *)malloc((long)iVar6 << 2);
  }
  pVVar4->pArray = __s;
  pVVar4->nSize = iVar3;
  memset(__s,0,(long)iVar3 << 2);
  pVVar5 = pNtk->vCis;
  if (0 < pVVar5->nSize) {
    fVar8 = (float)(nWords * 0x20);
    lVar7 = 0;
    do {
      pvVar1 = pVVar5->pArray[lVar7];
      iVar3 = *(int *)((long)pvVar1 + 0x10);
      if (((long)iVar3 < 0) || (vSimInfo->nSize <= iVar3)) goto LAB_0044da2c;
      puVar2 = (uint *)vSimInfo->pArray[iVar3];
      Sim_UtilSetRandom(puVar2,nWords);
      iVar3 = Sim_UtilCountOnes(puVar2,nWords);
      __s[*(int *)((long)pvVar1 + 0x10)] =
           (int)(((float)(nWords * 0x20 - iVar3) * (((float)iVar3 + (float)iVar3) / fVar8)) / fVar8)
      ;
      lVar7 = lVar7 + 1;
      pVVar5 = pNtk->vCis;
    } while (lVar7 < pVVar5->nSize);
  }
  pVVar5 = Abc_AigDfs(pNtk,1,0);
  if (0 < pVVar5->nSize) {
    fVar8 = (float)(nWords * 0x20);
    lVar7 = 0;
    do {
      pNode = (Abc_Obj_t *)pVVar5->pArray[lVar7];
      iVar3 = pNode->Id;
      if (((long)iVar3 < 0) || (vSimInfo->nSize <= iVar3)) {
LAB_0044da2c:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      puVar2 = (uint *)vSimInfo->pArray[iVar3];
      Sim_UtilSimulateNodeOne(pNode,vSimInfo,nWords,0);
      iVar3 = Sim_UtilCountOnes(puVar2,nWords);
      __s[pNode->Id] =
           (int)(((float)(nWords * 0x20 - iVar3) * (((float)iVar3 + (float)iVar3) / fVar8)) / fVar8)
      ;
      lVar7 = lVar7 + 1;
    } while (lVar7 < pVVar5->nSize);
  }
  if (pVVar5->pArray != (void **)0x0) {
    free(pVVar5->pArray);
    pVVar5->pArray = (void **)0x0;
  }
  if (pVVar5 != (Vec_Ptr_t *)0x0) {
    free(pVVar5);
  }
  Sim_UtilInfoFree(vSimInfo);
  return pVVar4;
}

Assistant:

Vec_Int_t * Sim_NtkComputeSwitching( Abc_Ntk_t * pNtk, int nPatterns )
{
    Vec_Int_t * vSwitching;
    float * pSwitching;
    Vec_Ptr_t * vNodes;
    Vec_Ptr_t * vSimInfo;
    Abc_Obj_t * pNode;
    unsigned * pSimInfo;
    int nSimWords, i;

    // allocate space for simulation info of all nodes
    nSimWords = SIM_NUM_WORDS(nPatterns);
    vSimInfo = Sim_UtilInfoAlloc( Abc_NtkObjNumMax(pNtk), nSimWords, 0 );
    // assign the random simulation to the CIs
    vSwitching = Vec_IntStart( Abc_NtkObjNumMax(pNtk) );
    pSwitching = (float *)vSwitching->pArray;
    Abc_NtkForEachCi( pNtk, pNode, i )
    {
        pSimInfo = (unsigned *)Vec_PtrEntry(vSimInfo, pNode->Id);
        Sim_UtilSetRandom( pSimInfo, nSimWords );
        pSwitching[pNode->Id] = Sim_ComputeSwitching( pSimInfo, nSimWords );
    }
    // simulate the internal nodes
    vNodes  = Abc_AigDfs( pNtk, 1, 0 );
    Vec_PtrForEachEntry( Abc_Obj_t *, vNodes, pNode, i )
    {
        pSimInfo = (unsigned *)Vec_PtrEntry(vSimInfo, pNode->Id);
        Sim_UtilSimulateNodeOne( pNode, vSimInfo, nSimWords, 0 );
        pSwitching[pNode->Id] = Sim_ComputeSwitching( pSimInfo, nSimWords );
    }
    Vec_PtrFree( vNodes );
    Sim_UtilInfoFree( vSimInfo );
    return vSwitching;
}